

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::emit_constant(CompilerGLSL *this,SPIRConstant *constant)

{
  string *ts_1;
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  ID id;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  uint32_t local_84;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  string local_68;
  string name;
  
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(constant->super_IVariant).field_0xc);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&name,this,(ulong)(constant->super_IVariant).self.id,1);
  wg_x.id.id = 0;
  wg_y.id.id = 0;
  wg_z.id.id = 0;
  uVar2 = Compiler::get_work_group_size_specialization_constants
                    (&this->super_Compiler,&wg_x,&wg_y,&wg_z);
  id.id = (constant->super_IVariant).self.id;
  if (id.id != uVar2) {
    bVar4 = true;
    if ((id.id != wg_x.id.id) && (id.id != wg_y.id.id)) {
      bVar4 = id.id == wg_z.id.id;
    }
    bVar1 = (this->options).vulkan_semantics;
    if ((bVar4 & bVar1) == 0) {
      if (bVar4 == true && bVar1 == false) {
        bVar1 = Compiler::has_decoration(&this->super_Compiler,id,DecorationSpecId);
        if (!bVar1) goto LAB_001b5da3;
        id.id = (constant->super_IVariant).self.id;
      }
      bVar1 = Compiler::has_decoration(&this->super_Compiler,id,DecorationSpecId);
      if (bVar1) {
        if ((this->options).vulkan_semantics == true) {
          local_84 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(constant->super_IVariant).self.id,
                                DecorationSpecId);
          (*(this->super_Compiler)._vptr_Compiler[0x1a])(&local_a8,this,pSVar3,&name,0);
          constant_expression_abi_cxx11_(&local_68,this,constant);
          statement<char_const(&)[22],unsigned_int,char_const(&)[9],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (this,(char (*) [22])"layout(constant_id = ",&local_84,(char (*) [9])") const ",
                     &local_a8,(char (*) [4])0x2f38c7,&local_68,(char (*) [2])0x2d9bde);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_001b5da3;
        }
        else {
          ts_1 = &constant->specialization_constant_macro_name;
          statement<char_const(&)[9],std::__cxx11::string_const&>
                    (this,(char (*) [9])"#ifndef ",ts_1);
          constant_expression_abi_cxx11_(&local_a8,this,constant);
          statement<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
                    (this,(char (*) [9])"#define ",ts_1,(char (*) [2])0x2e06c1,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
          if (bVar4 != false) goto LAB_001b5da3;
          (*(this->super_Compiler)._vptr_Compiler[0x1a])(&local_a8,this,pSVar3,&name,0);
          statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[2]>
                    (this,(char (*) [7])0x2dadac,&local_a8,(char (*) [4])0x2f38c7,ts_1,
                     (char (*) [2])0x2d9bde);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_001b5da3;
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x1a])(&local_a8,this,pSVar3,&name,0);
        constant_expression_abi_cxx11_(&local_68,this,constant);
        statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (this,(char (*) [7])0x2dadac,&local_a8,(char (*) [4])0x2f38c7,&local_68,
                   (char (*) [2])0x2d9bde);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_001b5da3;
      }
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
LAB_001b5da3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_constant(const SPIRConstant &constant)
{
	auto &type = get<SPIRType>(constant.constant_type);
	auto name = to_name(constant.self);

	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

	// This specialization constant is implicitly declared by emitting layout() in;
	if (constant.self == workgroup_size_id)
		return;

	// These specialization constants are implicitly declared by emitting layout() in;
	// In legacy GLSL, we will still need to emit macros for these, so a layout() in; declaration
	// later can use macro overrides for work group size.
	bool is_workgroup_size_constant = ConstantID(constant.self) == wg_x.id || ConstantID(constant.self) == wg_y.id ||
	                                  ConstantID(constant.self) == wg_z.id;

	if (options.vulkan_semantics && is_workgroup_size_constant)
	{
		// Vulkan GLSL does not need to declare workgroup spec constants explicitly, it is handled in layout().
		return;
	}
	else if (!options.vulkan_semantics && is_workgroup_size_constant &&
	         !has_decoration(constant.self, DecorationSpecId))
	{
		// Only bother declaring a workgroup size if it is actually a specialization constant, because we need macros.
		return;
	}

	// Only scalars have constant IDs.
	if (has_decoration(constant.self, DecorationSpecId))
	{
		if (options.vulkan_semantics)
		{
			statement("layout(constant_id = ", get_decoration(constant.self, DecorationSpecId), ") const ",
			          variable_decl(type, name), " = ", constant_expression(constant), ";");
		}
		else
		{
			const string &macro_name = constant.specialization_constant_macro_name;
			statement("#ifndef ", macro_name);
			statement("#define ", macro_name, " ", constant_expression(constant));
			statement("#endif");

			// For workgroup size constants, only emit the macros.
			if (!is_workgroup_size_constant)
				statement("const ", variable_decl(type, name), " = ", macro_name, ";");
		}
	}
	else
	{
		statement("const ", variable_decl(type, name), " = ", constant_expression(constant), ";");
	}
}